

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

EGLint deqp::egl::ChooseConfigRandomCase::getApiBits(Random *rnd)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar1 = de::Random::getBool(rnd);
  bVar2 = de::Random::getBool(rnd);
  bVar3 = de::Random::getBool(rnd);
  bVar4 = de::Random::getBool(rnd);
  return (uint)bVar2 + (uint)bVar1 * 8 + (uint)bVar3 * 4 + (uint)bVar4 * 2;
}

Assistant:

static EGLint getApiBits (de::Random& rnd)
	{
		EGLint api = 0;
		api |= rnd.getBool() ? EGL_OPENGL_BIT		: 0;
		api |= rnd.getBool() ? EGL_OPENGL_ES_BIT	: 0;
		api |= rnd.getBool() ? EGL_OPENGL_ES2_BIT	: 0;
		api |= rnd.getBool() ? EGL_OPENVG_BIT		: 0;
		return api;
	}